

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::base::Writer::initializeLogger(Writer *this,string *loggerId,bool lookup,bool needLock)

{
  pointer pcVar1;
  Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  RegisteredLoggers *this_01;
  bool bVar2;
  Logger *pLVar3;
  undefined7 in_register_00000011;
  Level level;
  TypedConfigurations *this_02;
  undefined1 local_a8 [32];
  LineNumber LStack_88;
  char *local_80;
  VerboseLevel local_78;
  Logger *local_70;
  bool local_68;
  MessageBuilder local_60;
  DispatchAction local_50;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  if ((int)CONCAT71(in_register_00000011,lookup) == 0) {
    pLVar3 = this->m_logger;
  }
  else {
    pLVar3 = RegisteredLoggers::get
                       (*(RegisteredLoggers **)(elStorage + 0x10),loggerId,
                        (bool)((byte)(*(uint *)(elStorage + 0x18) >> 0xc) & 1));
    this->m_logger = pLVar3;
  }
  if (pLVar3 == (Logger *)0x0) {
    this_00 = *(Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                **)(elStorage + 0x10);
    pcVar1 = local_a8 + 0x10;
    local_a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"default","");
    (*(this_00->
      super_AbstractRegistry<el::Logger,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_el::Logger_*>_>_>_>
      ).super_ThreadSafe._vptr_ThreadSafe[2])(this_00);
    pLVar3 = utils::
             Registry<el::Logger,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::get(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a8);
    if ((pointer)local_a8._0_8_ != pcVar1) {
      operator_delete((void *)local_a8._0_8_);
    }
    if (pLVar3 == (Logger *)0x0) {
      this_01 = *(RegisteredLoggers **)(elStorage + 0x10);
      local_a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"default","");
      RegisteredLoggers::get(this_01,(string *)local_a8,true);
      if ((pointer)local_a8._0_8_ != pcVar1) {
        operator_delete((void *)local_a8._0_8_);
      }
    }
    local_a8._24_8_ = this->m_file;
    LStack_88 = this->m_line;
    local_80 = this->m_func;
    local_a8._0_8_ = &PTR__Writer_00134bd0;
    local_a8._8_8_ = (LogMessage *)0x0;
    local_a8._16_4_ = 4;
    local_78 = 0;
    local_70 = (Logger *)0x0;
    local_68 = false;
    local_60.m_logger = (Logger *)0x0;
    local_60.m_containerLogSeperator = "";
    local_50 = NormalLog;
    local_48 = (pointer)0x0;
    pbStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    construct((Writer *)local_a8,1,"default");
    if (local_68 == true) {
      MessageBuilder::operator<<(&local_60,"Logger [");
    }
    if ((local_68 & 1U) != 0) {
      MessageBuilder::operator<<(&local_60,(loggerId->_M_dataplus)._M_p);
    }
    if ((local_68 & 1U) != 0) {
      MessageBuilder::operator<<(&local_60,"] is not registered yet!");
    }
    ~Writer((Writer *)local_a8);
    this->m_proceed = false;
    return;
  }
  if (needLock) {
    (**(pLVar3->super_ThreadSafe)._vptr_ThreadSafe)(pLVar3);
  }
  if ((*(byte *)(elStorage + 0x19) & 8) == 0) {
    level = this->m_level;
    this_02 = this->m_logger->m_typedConfigurations;
    (*(this_02->super_ThreadSafe)._vptr_ThreadSafe[2])(this_02);
  }
  else {
    if (this->m_level != Verbose) {
      bVar2 = *(Level *)(elStorage + 0x174) <= this->m_level;
      goto LAB_0011b1b3;
    }
    this_02 = this->m_logger->m_typedConfigurations;
    (*(this_02->super_ThreadSafe)._vptr_ThreadSafe[2])(this_02);
    level = Verbose;
  }
  bVar2 = TypedConfigurations::unsafeGetConfigByVal<bool>
                    (this_02,level,&this_02->m_enabledMap,"enabled");
LAB_0011b1b3:
  this->m_proceed = bVar2;
  return;
}

Assistant:

void Writer::initializeLogger(const std::string& loggerId, bool lookup, bool needLock) {
  if (lookup) {
    m_logger = ELPP->registeredLoggers()->get(loggerId, ELPP->hasFlag(LoggingFlag::CreateLoggerAutomatically));
  }
  if (m_logger == nullptr) {
    {
      if (!ELPP->registeredLoggers()->has(std::string(base::consts::kDefaultLoggerId))) {
        // Somehow default logger has been unregistered. Not good! Register again
        ELPP->registeredLoggers()->get(std::string(base::consts::kDefaultLoggerId));
      }
    }
    Writer(Level::Debug, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
        << "Logger [" << loggerId << "] is not registered yet!";
    m_proceed = false;
  } else {
    if (needLock) {
      m_logger->acquireLock();  // This should not be unlocked by checking m_proceed because
      // m_proceed can be changed by lines below
    }
    if (ELPP->hasFlag(LoggingFlag::HierarchicalLogging)) {
      m_proceed = m_level == Level::Verbose ? m_logger->enabled(m_level) :
                  LevelHelper::castToInt(m_level) >= LevelHelper::castToInt(ELPP->m_loggingLevel);
    } else {
      m_proceed = m_logger->enabled(m_level);
    }
  }
}